

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_8f4e27::Target::DumpCompileData
          (Value *__return_storage_ptr__,Target *this,CompileData *cd)

{
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  Value local_1e0;
  Value local_1b8;
  reference local_190;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *d;
  iterator __end2_1;
  iterator __begin2_1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  Value defines;
  Value local_120;
  reference local_f8;
  IncludeEntry *i;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *__range2;
  Value includes;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  CompileData *local_20;
  CompileData *cd_local;
  Target *this_local;
  Value *result;
  
  local_21 = 0;
  local_20 = cd;
  cd_local = (CompileData *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Json::Value::Value(&local_50,&cd->Language);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"language");
    Json::Value::operator=(pVVar3,&local_50);
    Json::Value::~Value(&local_50);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    DumpSysroot(&local_88,this,&cd->Sysroot);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
    Json::Value::operator=(pVVar3,&local_88);
    Json::Value::~Value(&local_88);
  }
  bVar1 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&cd->Flags);
  if (!bVar1) {
    DumpCommandFragments((Value *)&includes.limit_,this,&cd->Flags);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"compileCommandFragments");
    Json::Value::operator=(pVVar3,(Value *)&includes.limit_);
    Json::Value::~Value((Value *)&includes.limit_);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::empty(&cd->Includes);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2,arrayValue);
    __end2 = std::
             vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             ::begin(&cd->Includes);
    i = (IncludeEntry *)
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::end(&cd->Includes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
                                       *)&i), bVar1) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
                 ::operator*(&__end2);
      DumpInclude(&local_120,this,local_f8);
      Json::Value::append((Value *)&__range2,&local_120);
      Json::Value::~Value(&local_120);
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
      ::operator++(&__end2);
    }
    Json::Value::Value((Value *)&defines.limit_,(Value *)&__range2);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"includes");
    Json::Value::operator=(pVVar3,(Value *)&defines.limit_);
    Json::Value::~Value((Value *)&defines.limit_);
    Json::Value::~Value((Value *)&__range2);
  }
  bVar1 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&cd->Defines);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2_1,arrayValue);
    __end2_1 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&cd->Defines);
    d = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end(&cd->Defines);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&d), bVar1) {
      local_190 = __gnu_cxx::
                  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2_1);
      DumpDefine(&local_1b8,this,local_190);
      Json::Value::append((Value *)&__range2_1,&local_1b8);
      Json::Value::~Value(&local_1b8);
      __gnu_cxx::
      __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
    Json::Value::Value(&local_1e0,(Value *)&__range2_1);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"defines");
    Json::Value::operator=(pVVar3,&local_1e0);
    Json::Value::~Value(&local_1e0);
    Json::Value::~Value((Value *)&__range2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCompileData(CompileData cd)
{
  Json::Value result = Json::objectValue;

  if (!cd.Language.empty()) {
    result["language"] = cd.Language;
  }
  if (!cd.Sysroot.empty()) {
    result["sysroot"] = this->DumpSysroot(cd.Sysroot);
  }
  if (!cd.Flags.empty()) {
    result["compileCommandFragments"] = this->DumpCommandFragments(cd.Flags);
  }
  if (!cd.Includes.empty()) {
    Json::Value includes = Json::arrayValue;
    for (auto const& i : cd.Includes) {
      includes.append(this->DumpInclude(i));
    }
    result["includes"] = includes;
  }
  if (!cd.Defines.empty()) {
    Json::Value defines = Json::arrayValue;
    for (BT<std::string> const& d : cd.Defines) {
      defines.append(this->DumpDefine(d));
    }
    result["defines"] = std::move(defines);
  }

  return result;
}